

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void Curl_ssl_close_all(Curl_easy *data)

{
  ulong local_18;
  size_t i;
  Curl_easy *data_local;
  
  if (((data->state).session != (curl_ssl_session *)0x0) &&
     ((data->share == (Curl_share *)0x0 || ((data->share->specifier & 0x10) == 0)))) {
    for (local_18 = 0; local_18 < (data->set).general_ssl.max_ssl_sessions; local_18 = local_18 + 1)
    {
      Curl_ssl_kill_session((data->state).session + local_18);
    }
    (*Curl_cfree)((data->state).session);
    (data->state).session = (curl_ssl_session *)0x0;
  }
  (*Curl_ssl->close_all)(data);
  return;
}

Assistant:

void Curl_ssl_close_all(struct Curl_easy *data)
{
  /* kill the session ID cache if not shared */
  if(data->state.session && !SSLSESSION_SHARED(data)) {
    size_t i;
    for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++)
      /* the single-killer function handles empty table slots */
      Curl_ssl_kill_session(&data->state.session[i]);

    /* free the cache data */
    Curl_safefree(data->state.session);
  }

  Curl_ssl->close_all(data);
}